

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsRectItem::paint
          (QGraphicsRectItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  Int IVar1;
  QPen *in_RSI;
  QPainter *in_RDI;
  long in_FS_OFFSET;
  QGraphicsRectItemPrivate *d;
  undefined4 in_stack_ffffffffffffffb8;
  StateFlag in_stack_ffffffffffffffbc;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGraphicsRectItem *)0x988ce9);
  QPainter::setPen(in_RSI);
  QPainter::setBrush((QBrush *)in_RSI);
  QPainter::drawRect(in_RDI,(QRectF *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  local_c.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&
                 ((QFlags<QStyle::StateFlag> *)in_RDI,in_stack_ffffffffffffffbc);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  if (IVar1 != 0) {
    qt_graphicsItem_highlightSelected
              ((QGraphicsItem *)option,(QPainter *)widget,(QStyleOptionGraphicsItem *)d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsRectItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option,
                              QWidget *widget)
{
    Q_D(QGraphicsRectItem);
    Q_UNUSED(widget);
    painter->setPen(d->pen);
    painter->setBrush(d->brush);
    painter->drawRect(d->rect);

    if (option->state & QStyle::State_Selected)
        qt_graphicsItem_highlightSelected(this, painter, option);
}